

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall aiAnimMesh::~aiAnimMesh(aiAnimMesh *this)

{
  uint local_18;
  uint local_14;
  uint a_1;
  uint a;
  aiAnimMesh *this_local;
  
  if (this->mVertices != (aiVector3D *)0x0) {
    operator_delete__(this->mVertices);
  }
  if (this->mNormals != (aiVector3D *)0x0) {
    operator_delete__(this->mNormals);
  }
  if (this->mTangents != (aiVector3D *)0x0) {
    operator_delete__(this->mTangents);
  }
  if (this->mBitangents != (aiVector3D *)0x0) {
    operator_delete__(this->mBitangents);
  }
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    if (this->mTextureCoords[local_14] != (aiVector3D *)0x0) {
      operator_delete__(this->mTextureCoords[local_14]);
    }
  }
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    if (this->mColors[local_18] != (aiColor4D *)0x0) {
      operator_delete__(this->mColors[local_18]);
    }
  }
  return;
}

Assistant:

~aiAnimMesh()
    {
        delete [] mVertices;
        delete [] mNormals;
        delete [] mTangents;
        delete [] mBitangents;
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; a++) {
            delete [] mTextureCoords[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; a++) {
            delete [] mColors[a];
        }
    }